

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O1

void __thiscall MPL::detail::ModelPackageImpl::~ModelPackageImpl(ModelPackageImpl *this)

{
  path *__p;
  ModelPackageImpl *this_00;
  path uniquedDestination;
  path suffix;
  error_code ecode;
  ofstream uniquedStream;
  path local_278;
  path local_250;
  error_code local_228;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  if (this->m_readOnly == false) {
    __p = &this->m_manifestPath;
    this_00 = (ModelPackageImpl *)__p;
    std::filesystem::__cxx11::path::path(&local_278,__p);
    generateIdentifier_abi_cxx11_((string *)local_218,this_00);
    std::filesystem::__cxx11::path::path(&local_250,(string_type *)local_218,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._0_8_ != &local_208) {
      operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::replace_extension(&local_278);
    std::ofstream::ofstream(local_218,local_278._M_pathname._M_dataplus._M_p,_S_bin);
    JsonMap::serialize((this->m_manifest)._M_t.
                       super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                       super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                       super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,(ostream *)local_218);
    std::ofstream::close();
    if ((abStack_1f8[*(long *)(local_218._0_8_ + -0x18)] & 5) == 0) {
      local_228._M_value = 0;
      local_228._M_cat = (error_category *)std::_V2::system_category();
      std::filesystem::rename(&local_278,__p,&local_228);
      if (local_228._M_value != 0) {
        std::filesystem::remove(&local_278);
      }
    }
    local_218._0_8_ = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT->_M_local_buf + -0x18)) = _strtod;
    std::filebuf::~filebuf((filebuf *)(local_218 + 8));
    std::ios_base::~ios_base(local_120);
    std::filesystem::__cxx11::path::~path(&local_250);
    std::filesystem::__cxx11::path::~path(&local_278);
  }
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&this->m_manifest);
  std::filesystem::__cxx11::path::~path(&this->m_packageDataDirPath);
  std::filesystem::__cxx11::path::~path(&this->m_manifestPath);
  std::filesystem::__cxx11::path::~path(&this->m_packagePath);
  return;
}

Assistant:

ModelPackageImpl::~ModelPackageImpl()
{
    if (m_readOnly) {
        return;
    }
    
    std::filesystem::path uniquedDestination(m_manifestPath);
    std::filesystem::path suffix(generateIdentifier()); // std::filesystem::path from stringified UUID
    uniquedDestination.replace_extension(suffix); // unique filename in the presumed writable directory where Manifest.json is sited
    
    std::ofstream uniquedStream(uniquedDestination, std::ios::binary);
    m_manifest->serialize(uniquedStream);
    uniquedStream.close();
    if (uniquedStream.fail()) { // If any of the above fail do not go on to move uniquedDestination to m_manifestPath.
        return;
    }
    
    std::error_code ecode;
    std::filesystem::rename(uniquedDestination, m_manifestPath, ecode); // On failure sets ecode and makes no changes. Does not throw.
    if (ecode.value()) {
        std::filesystem::remove(uniquedDestination);
    }
}